

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeTangent
          (ChVector<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi)

{
  ChVector<double> *v;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_1a8;
  VectorN *local_1a0;
  ChVector<double> local_198;
  VectorN local_180;
  Matrix3xN local_140;
  
  Calc_Sxi_xi_compact(this,&local_180,xi,0.0,0.0);
  CalcCoordMatrix(this,&local_140);
  local_1a8 = &local_140;
  local_1a0 = &local_180;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,8,1,3,8>,Eigen::Matrix<double,8,1,0,8,1>,0>>
            (&local_198,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>_>
              *)&local_1a8,(type *)0x0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_198.m_data[0];
  __return_storage_ptr__->m_data[0] = local_198.m_data[0];
  __return_storage_ptr__->m_data[1] = local_198.m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_198.m_data[2];
  __return_storage_ptr__->m_data[2] = local_198.m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_198.m_data[1] * local_198.m_data[1];
  auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar3);
  auVar2 = vfmadd231sd_fma(auVar2,auVar4,auVar4);
  if (auVar2._0_8_ < 0.0) {
    dVar1 = sqrt(auVar2._0_8_);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar1 = auVar2._0_8_;
  }
  if (dVar1 < 2.2250738585072014e-308) {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    local_198.m_data[2] = 0.0;
  }
  else {
    dVar1 = 1.0 / dVar1;
    __return_storage_ptr__->m_data[0] = local_198.m_data[0] * dVar1;
    __return_storage_ptr__->m_data[1] = local_198.m_data[1] * dVar1;
    local_198.m_data[2] = local_198.m_data[2] * dVar1;
  }
  __return_storage_ptr__->m_data[2] = local_198.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementBeamANCF_3243::ComputeTangent(const double xi) {
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // partial derivative of the position vector with respect to xi (normalized coordinate along the beam axis).  In
    // general, this will not be a unit vector
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact;

    return BeamAxisTangent.GetNormalized();
}